

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::FloatingPointLE<float>
          (internal *this,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  stringstream val2_ss;
  stringstream val1_ss;
  char *local_390;
  char *local_388;
  FloatingPointUnion local_380;
  FloatingPointUnion local_37c;
  string local_378;
  string local_358;
  AssertionResult local_338;
  stringstream local_328 [16];
  long local_318;
  undefined8 auStack_310 [46];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 auStack_188 [46];
  
  if (val2 <= val1) {
    local_390 = expr2;
    local_388 = expr1;
    local_380.value_ = val2;
    local_37c.value_ = val1;
    bVar1 = FloatingPoint<float>::AlmostEquals
                      ((FloatingPoint<float> *)&local_37c,(FloatingPoint<float> *)&local_380);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      *(undefined8 *)((long)auStack_188 + *(long *)(local_190 + -0x18)) = 8;
      std::ostream::operator<<(&local_190,val1);
      std::__cxx11::stringstream::stringstream(local_328);
      *(undefined8 *)((long)auStack_310 + *(long *)(local_318 + -0x18)) = 8;
      std::ostream::operator<<(&local_318,val2);
      local_338.success_ = false;
      local_338.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_338,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_388);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_390);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x21b403);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x21ad31);
      StringStreamToString(&local_358,(stringstream *)local_1a0);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_358);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_378,(stringstream *)local_328);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_378);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_358);
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&local_338.message_);
      std::__cxx11::stringstream::~stringstream(local_328);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_001d355b;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_001d355b:
  AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}